

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O0

int32_t u_strlen_63(UChar *s)

{
  UChar *local_18;
  UChar *t;
  UChar *s_local;
  
  for (local_18 = s; *local_18 != L'\0'; local_18 = local_18 + 1) {
  }
  return (int32_t)((long)local_18 - (long)s >> 1);
}

Assistant:

U_CAPI int32_t   U_EXPORT2
u_strlen(const UChar *s) 
{
#if U_SIZEOF_WCHAR_T == U_SIZEOF_UCHAR
    return (int32_t)uprv_wcslen((const wchar_t *)s);
#else
    const UChar *t = s;
    while(*t != 0) {
      ++t;
    }
    return t - s;
#endif
}